

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintLen(char *string,UNITY_UINT32 length)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  int __c;
  char *pch;
  char *pcVar4;
  byte bVar5;
  
  if ((string != (char *)0x0) && (bVar5 = *string, pcVar4 = string, length != 0 && bVar5 != 0)) {
    do {
      uVar2 = (uint)bVar5;
      if ((byte)(bVar5 - 0x20) < 0x5f) {
LAB_0010417f:
        putchar(uVar2);
      }
      else {
        putchar(0x5c);
        if (bVar5 == 0xd) {
          uVar2 = 0x72;
          goto LAB_0010417f;
        }
        if (bVar5 == 10) {
          uVar2 = 0x6e;
          goto LAB_0010417f;
        }
        putchar(0x78);
        cVar1 = *pcVar4;
        uVar3 = 3;
        bVar5 = 4;
        do {
          uVar2 = (uint)((ulong)(long)cVar1 >> (bVar5 & 0x3f)) & 0xf;
          __c = uVar2 + 0x30;
          if (9 < uVar2) {
            __c = uVar2 + 0x37;
          }
          putchar(__c);
          uVar3 = uVar3 - 1;
          bVar5 = bVar5 - 4;
        } while (1 < uVar3);
      }
      bVar5 = pcVar4[1];
    } while ((bVar5 != 0) && (pcVar4 = pcVar4 + 1, (uint)((int)pcVar4 - (int)string) < length));
  }
  return;
}

Assistant:

void UnityPrintLen(const char* string, const UNITY_UINT32 length)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch && ((UNITY_UINT32)(pch - string) < length))
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((UNITY_UINT)*pch, 2);
            }
            pch++;
        }
    }
}